

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O0

void check_waitpid_and_exit(pid_t pid)

{
  int iVar1;
  int local_14;
  __pid_t local_10;
  int status;
  pid_t pid_w;
  pid_t pid_local;
  
  status = pid;
  if (0 < pid) {
    do {
      local_10 = waitpid(status,&local_14,0);
    } while (local_10 == -1);
    iVar1 = waserror(local_14,0);
    if (iVar1 != 0) {
      exit(1);
    }
  }
  exit(0);
}

Assistant:

void check_waitpid_and_exit(pid_t pid CK_ATTRIBUTE_UNUSED)
{
#if defined(HAVE_FORK) && HAVE_FORK==1
    pid_t pid_w;
    int status;

    if(pid > 0)
    {
        do
        {
            pid_w = waitpid(pid, &status, 0);
        }
        while(pid_w == -1);
        if(waserror(status, 0))
        {
            exit(EXIT_FAILURE);
        }
    }
    exit(EXIT_SUCCESS);
#else /* HAVE_FORK */
    /* Ignoring, as Check is not compiled with fork support. */
    exit(EXIT_FAILURE);
#endif /* HAVE_FORK */
}